

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O2

S2Point * __thiscall
S2Builder::GetCoverageEndpoint
          (S2Point *__return_storage_ptr__,S2Builder *this,S2Point *p,S2Point *x,S2Point *y,
          S2Point *n)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  S2Point nXp;
  double local_58;
  double dStack_50;
  double local_48;
  double local_38;
  double dStack_30;
  double local_28;
  
  dVar7 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Norm2
                    ((BasicVector<Vector3,_double,_3UL> *)n);
  dVar8 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                    ((BasicVector<Vector3,_double,_3UL> *)n,p);
  Vector3<double>::CrossProd(n,p);
  dVar1 = p->c_[2];
  dVar2 = n->c_[2];
  dVar9 = 1.0 - this->edge_snap_radius_sin2_;
  dVar3 = p->c_[0];
  dVar4 = p->c_[1];
  dVar5 = n->c_[0];
  dVar6 = n->c_[1];
  if (dVar9 < 0.0) {
    dVar9 = sqrt(dVar9);
  }
  else {
    dVar9 = SQRT(dVar9);
  }
  dVar10 = this->edge_snap_radius_sin2_ * dVar7 - dVar8 * dVar8;
  if (dVar10 <= 0.0) {
    dVar10 = 0.0;
  }
  dVar10 = SQRT(dVar10);
  local_38 = dVar10 * local_58 + (dVar7 * dVar3 - dVar8 * dVar5) * dVar9;
  dStack_30 = dVar10 * dStack_50 + (dVar7 * dVar4 - dVar8 * dVar6) * dVar9;
  local_28 = dVar10 * local_48 + (dVar1 * dVar7 - dVar2 * dVar8) * dVar9;
  util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Normalize
            (__return_storage_ptr__,(BasicVector<Vector3,_double,_3UL> *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

S2Point S2Builder::GetCoverageEndpoint(const S2Point& p, const S2Point& x,
                                       const S2Point& y, const S2Point& n)
    const {
  // Consider the plane perpendicular to P that cuts off a spherical cap of
  // radius snap_radius().  This plane intersects the plane through the edge
  // XY (perpendicular to N) along a line, and that line intersects the unit
  // sphere at two points Q and R, and we want to return the point R that is
  // further along the edge XY toward Y.
  //
  // Let M be the midpoint of QR.  This is the point along QR that is closest
  // to P.  We can now express R as the sum of two perpendicular vectors OM
  // and MR in the plane XY.  Vector MR is in the direction N x P, while
  // vector OM is in the direction (N x P) x N, where N = X x Y.
  //
  // The length of OM can be found using the Pythagorean theorem on triangle
  // OPM, and the length of MR can be found using the Pythagorean theorem on
  // triangle OMR.
  //
  // In the calculations below, we save some work by scaling all the vectors
  // by n.CrossProd(p).Norm2(), and normalizing at the end.
  double n2 = n.Norm2();
  double nDp = n.DotProd(p);
  S2Point nXp = n.CrossProd(p);
  S2Point nXpXn = n2 * p - nDp * n;
  Vector3_d om = sqrt(1 - edge_snap_radius_sin2_) * nXpXn;
  double mr2 = edge_snap_radius_sin2_ * n2 - nDp * nDp;

  // MR is constructed so that it points toward Y (rather than X).
  Vector3_d mr = sqrt(max(0.0, mr2)) * nXp;
  return (om + mr).Normalize();
}